

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O2

void __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
::ParserTemplate(ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                 *this,ColladaParserAutoGen15 *impl,IErrorHandler *errorHandler)

{
  _Rb_tree_header *p_Var1;
  
  ParserTemplateBase::ParserTemplateBase(&this->super_ParserTemplateBase,errorHandler);
  (this->super_ParserTemplateBase).super_Parser._vptr_Parser =
       (_func_int **)&PTR__ParserTemplate_009542c8;
  (this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mCurrentElementFunctionMap = &this->mElementFunctionMap;
  this->mImpl = impl;
  this->mUnknownHandler = (IUnknownElementHandler *)0x0;
  p_Var1 = &(this->mNamespaceHandlers)._M_t._M_impl.super__Rb_tree_header;
  (this->mNamespaceHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mNamespaceHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->mNamespaceHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mNamespaceHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mNamespaceHandlers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mActiveNamespaceHandler = (INamespaceHandler *)0x0;
  std::
  stack<GeneratedSaxParser::NamespaceStackFrame,std::deque<GeneratedSaxParser::NamespaceStackFrame,std::allocator<GeneratedSaxParser::NamespaceStackFrame>>>
  ::
  stack<std::deque<GeneratedSaxParser::NamespaceStackFrame,std::allocator<GeneratedSaxParser::NamespaceStackFrame>>,void>
            (&this->mNamespacesStack);
  (this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mLaxNamespaceHandling = false;
  this->mIgnoreElements = 0;
  this->mUnknownElements = 0;
  this->mNamespaceElements = 0;
  return;
}

Assistant:

ParserTemplate(ImplClass* impl, IErrorHandler* errorHandler)
			:
		  ParserTemplateBase(errorHandler),
              mCurrentElementFunctionMap(&mElementFunctionMap),
			  mImpl(impl),
              mUnknownHandler(0),
              mActiveNamespaceHandler(0),
              mLaxNamespaceHandling(false),
			  mIgnoreElements(0),
              mUnknownElements(0),
              mNamespaceElements(0)
		  {}